

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_deserialize_map_element
          (t_cpp_generator *this,ostream *out,t_map *tmap,string *prefix)

{
  t_type *ptVar1;
  ostream *poVar2;
  string key;
  string val;
  t_field fval;
  t_field fkey;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  t_field local_190;
  t_field local_e0;
  
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"_key","");
  t_generator::tmp(&local_2f0,(t_generator *)this,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"_val","");
  t_generator::tmp(&local_1d0,(t_generator *)this,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  ptVar1 = tmap->key_type_;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,local_2f0._M_dataplus._M_p,
             local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
  t_field::t_field(&local_e0,ptVar1,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  ptVar1 = tmap->val_type_;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_1d0._M_dataplus._M_p,
             local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
  t_field::t_field(&local_190,ptVar1,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_310._M_dataplus._M_p,local_310._M_string_length);
  declare_field_abi_cxx11_(&local_250,this,&local_e0,false,false,false,false);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"");
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"");
  generate_deserialize_field(this,out,&local_e0,&local_270,&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  declare_field_abi_cxx11_(&local_310,this,&local_190,false,false,false,true);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_310._M_dataplus._M_p,local_310._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"];",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
  generate_deserialize_field(this,out,&local_190,&local_2b0,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  t_field::~t_field(&local_190);
  t_field::~t_field(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_deserialize_map_element(ostream& out, t_map* tmap, string prefix) {
  string key = tmp("_key");
  string val = tmp("_val");
  t_field fkey(tmap->get_key_type(), key);
  t_field fval(tmap->get_val_type(), val);

  out << indent() << declare_field(&fkey) << endl;

  generate_deserialize_field(out, &fkey);
  indent(out) << declare_field(&fval, false, false, false, true) << " = " << prefix << "[" << key
              << "];" << endl;

  generate_deserialize_field(out, &fval);
}